

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

nhdp_naddr * nhdp_db_neighbor_addr_add(nhdp_neighbor *neigh,netaddr *addr)

{
  nhdp_naddr *naddr;
  netaddr *addr_local;
  nhdp_neighbor *neigh_local;
  
  neigh_local = (nhdp_neighbor *)oonf_class_malloc(&_naddr_info);
  if (neigh_local == (nhdp_neighbor *)0x0) {
    neigh_local = (nhdp_neighbor *)0x0;
  }
  else {
    *(undefined8 *)((netaddr *)&((nhdp_link *)neigh_local)->vtime_value)->_addr =
         *(undefined8 *)addr->_addr;
    *(undefined8 *)((netaddr *)&((nhdp_link *)neigh_local)->itime_value)->_addr =
         *(undefined8 *)(addr->_addr + 8);
    *(undefined2 *)((netaddr *)&((nhdp_link *)neigh_local)->sym_time)->_addr =
         *(undefined2 *)&addr->_type;
    *(nhdp_neighbor **)&((avl_node *)((long)&((nhdp_link *)neigh_local)->heard_time + 0x40))->list =
         neigh_local;
    ((nhdp_neighbor_domaindata *)((long)&((nhdp_link *)neigh_local)->vtime + 0x18))->metric =
         (nhdp_metric)neigh_local;
    *(nhdp_neighbor **)((long)&((nhdp_link *)neigh_local)->sym_time + 8) = neigh;
    *(oonf_timer_class **)((long)&((nhdp_link *)neigh_local)->sym_time + 0x50) = &_naddr_vtime_info;
    avl_insert(&_naddr_tree,(avl_node *)((long)&((nhdp_link *)neigh_local)->heard_time + 0x50));
    avl_insert(&neigh->_neigh_addresses,
               (avl_node *)&((avl_tree *)&((nhdp_link *)neigh_local)->heard_time)->count);
    oonf_class_event(&_naddr_info,neigh_local,OONF_OBJECT_ADDED);
  }
  return (nhdp_naddr *)neigh_local;
}

Assistant:

struct nhdp_naddr *
nhdp_db_neighbor_addr_add(struct nhdp_neighbor *neigh, const struct netaddr *addr) {
  struct nhdp_naddr *naddr;

  naddr = oonf_class_malloc(&_naddr_info);
  if (naddr == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&naddr->neigh_addr, addr, sizeof(naddr->neigh_addr));
  naddr->_neigh_node.key = &naddr->neigh_addr;
  naddr->_global_node.key = &naddr->neigh_addr;

  /* initialize backward link */
  naddr->neigh = neigh;

  /* initialize timer for lost addresses */
  naddr->_lost_vtime.class = &_naddr_vtime_info;

  /* add to trees */
  avl_insert(&_naddr_tree, &naddr->_global_node);
  avl_insert(&neigh->_neigh_addresses, &naddr->_neigh_node);

  /* trigger event */
  oonf_class_event(&_naddr_info, naddr, OONF_OBJECT_ADDED);

  return naddr;
}